

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FS.cpp
# Opt level: O2

ssize_t File::read(int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  istream *piVar2;
  undefined4 in_register_0000003c;
  bool bVar3;
  string line;
  string local_258;
  ifstream in;
  int aiStack_218 [122];
  
  std::__cxx11::string::assign((char *)__buf);
  std::ifstream::ifstream(&in,*(char **)CONCAT44(in_register_0000003c,__fd),_S_in);
  iVar1 = *(int *)((long)aiStack_218 + *(long *)(_in + -0x18));
  if (iVar1 == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)&line);
    bVar3 = true;
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&in,(string *)&line);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      if (bVar3) {
        removeBOM(&local_258,&line);
        std::__cxx11::string::operator=((string *)&line,(string *)&local_258);
        std::__cxx11::string::~string((string *)&local_258);
      }
      std::operator+(&local_258,&line,'\n');
      std::__cxx11::string::append((string *)__buf);
      std::__cxx11::string::~string((string *)&local_258);
      bVar3 = false;
    }
    std::ifstream::close();
    std::__cxx11::string::~string((string *)&line);
  }
  std::ifstream::~ifstream(&in);
  return CONCAT71((int7)((ulong)__buf >> 8),iVar1 == 0) & 0xffffffff;
}

Assistant:

bool File::read (const std::string& name, std::string& contents)
{
  contents = "";

  std::ifstream in (name.c_str ());
  if (in.good ())
  {
    bool first = true;
    std::string line;
    line.reserve (1024);
    while (getline (in, line))
    {
      // Detect forbidden BOM on first line.
      if (first)
      {
        line = File::removeBOM (line);
        first = false;
      }

      contents += line + '\n';
    }

    in.close ();
    return true;
  }

  return false;
}